

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HullFinder.cpp
# Opt level: O2

void __thiscall OpenMD::HullFinder::HullFinder(HullFinder *this,SimInfo *info)

{
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  Molecule *pMVar1;
  pointer ppAVar2;
  pointer ppRVar3;
  pointer ppBVar4;
  pointer ppBVar5;
  pointer ppTVar6;
  pointer ppIVar7;
  Atom *pAVar8;
  RigidBody *pRVar9;
  Bond *pBVar10;
  Bend *pBVar11;
  Torsion *pTVar12;
  Inversion *pIVar13;
  pointer ppSVar14;
  MoleculeIterator mi;
  StuntDouble *sd;
  MoleculeIterator local_70;
  vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *local_68;
  vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *local_60;
  vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *local_58;
  vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  HullFinder *local_40;
  StuntDouble *local_38;
  
  this->info_ = info;
  this_00 = &this->stuntdoubles_;
  local_50 = &this->bonds_;
  local_58 = &this->bends_;
  local_60 = &this->torsions_;
  local_68 = &this->molecules_;
  this_01 = &this->nObjects_;
  (this->localSites_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->localSites_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->localSites_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(this_00,0,0xa8);
  local_70._M_node._0_4_ = info->nGlobalRigidBodies_ + info->nGlobalAtoms_;
  local_48 = this_01;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_70);
  local_70._M_node._0_4_ = this->info_->nGlobalBonds_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_70);
  local_70._M_node._0_4_ = this->info_->nGlobalBends_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_70);
  local_70._M_node._0_4_ = this->info_->nGlobalTorsions_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_70);
  local_70._M_node._0_4_ = this->info_->nGlobalInversions_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_70);
  local_70._M_node._0_4_ = this->info_->nGlobalMols_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_70);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::resize
            (this_00,(long)*(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::resize
            (local_50,(long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[1]);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::resize
            (local_58,(long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[2]);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::resize
            (local_60,(long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[3]);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::resize
            (&this->inversions_,
             (long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[4]);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::resize
            (local_68,(long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[5]);
  local_70._M_node = (_Base_ptr)0x0;
  local_40 = this;
  pMVar1 = SimInfo::beginMolecule(this->info_,&local_70);
  while (pMVar1 != (Molecule *)0x0) {
    (local_68->super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>)._M_impl.
    super__Vector_impl_data._M_start[pMVar1->globalIndex_] = pMVar1;
    ppSVar14 = (pMVar1->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar14 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00215ca1;
    local_38 = (StuntDouble *)0x0;
    while (local_38 != (StuntDouble *)0x0) {
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                (&this->localSites_,&local_38);
      ppSVar14 = ppSVar14 + 1;
      local_38 = (StuntDouble *)0x0;
      if (ppSVar14 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00215ca1:
        local_38 = *ppSVar14;
      }
    }
    ppAVar2 = (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar2 !=
        (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_00215cd2;
    pAVar8 = (Atom *)0x0;
    while (pAVar8 != (Atom *)0x0) {
      (this_00->super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>).
      _M_impl.super__Vector_impl_data._M_start[(pAVar8->super_StuntDouble).globalIndex_] =
           &pAVar8->super_StuntDouble;
      ppAVar2 = ppAVar2 + 1;
      pAVar8 = (Atom *)0x0;
      if (ppAVar2 !=
          (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_00215cd2:
        pAVar8 = *ppAVar2;
      }
    }
    ppRVar3 = (pMVar1->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppRVar3 !=
        (pMVar1->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00215d0b;
    pRVar9 = (RigidBody *)0x0;
    while (pRVar9 != (RigidBody *)0x0) {
      (this_00->super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>).
      _M_impl.super__Vector_impl_data._M_start[(pRVar9->super_StuntDouble).globalIndex_] =
           &pRVar9->super_StuntDouble;
      ppRVar3 = ppRVar3 + 1;
      pRVar9 = (RigidBody *)0x0;
      if (ppRVar3 !=
          (pMVar1->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00215d0b:
        pRVar9 = *ppRVar3;
      }
    }
    ppBVar4 = (pMVar1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar4 !=
        (pMVar1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_00215d40;
    pBVar10 = (Bond *)0x0;
    while (pBVar10 != (Bond *)0x0) {
      (local_50->super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>)._M_impl.
      super__Vector_impl_data._M_start[(pBVar10->super_ShortRangeInteraction).globalIndex_] =
           pBVar10;
      ppBVar4 = ppBVar4 + 1;
      pBVar10 = (Bond *)0x0;
      if (ppBVar4 !=
          (pMVar1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_00215d40:
        pBVar10 = *ppBVar4;
      }
    }
    ppBVar5 = (pMVar1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar5 !=
        (pMVar1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_00215d75;
    pBVar11 = (Bend *)0x0;
    while (pBVar11 != (Bend *)0x0) {
      (local_58->super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>)._M_impl.
      super__Vector_impl_data._M_start[(pBVar11->super_ShortRangeInteraction).globalIndex_] =
           pBVar11;
      ppBVar5 = ppBVar5 + 1;
      pBVar11 = (Bend *)0x0;
      if (ppBVar5 !=
          (pMVar1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_00215d75:
        pBVar11 = *ppBVar5;
      }
    }
    ppTVar6 = (pMVar1->torsions_).
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppTVar6 !=
        (pMVar1->torsions_).
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00215daa;
    pTVar12 = (Torsion *)0x0;
    while (pTVar12 != (Torsion *)0x0) {
      (local_60->super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>)._M_impl.
      super__Vector_impl_data._M_start[(pTVar12->super_ShortRangeInteraction).globalIndex_] =
           pTVar12;
      ppTVar6 = ppTVar6 + 1;
      pTVar12 = (Torsion *)0x0;
      if (ppTVar6 !=
          (pMVar1->torsions_).
          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00215daa:
        pTVar12 = *ppTVar6;
      }
    }
    ppIVar7 = (pMVar1->inversions_).
              super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar7 !=
        (pMVar1->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00215ddb;
    pIVar13 = (Inversion *)0x0;
    while (pIVar13 != (Inversion *)0x0) {
      (this->inversions_).
      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
      super__Vector_impl_data._M_start[(pIVar13->super_ShortRangeInteraction).globalIndex_] =
           pIVar13;
      ppIVar7 = ppIVar7 + 1;
      pIVar13 = (Inversion *)0x0;
      if (ppIVar7 !=
          (pMVar1->inversions_).
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00215ddb:
        pIVar13 = *ppIVar7;
      }
    }
    pMVar1 = SimInfo::nextMolecule(local_40->info_,&local_70);
  }
  return;
}

Assistant:

HullFinder::HullFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    stuntdoubles_.resize(nObjects_[STUNTDOUBLE]);
    bonds_.resize(nObjects_[BOND]);
    bends_.resize(nObjects_[BEND]);
    torsions_.resize(nObjects_[TORSION]);
    inversions_.resize(nObjects_[INVERSION]);
    molecules_.resize(nObjects_[MOLECULE]);

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    StuntDouble* sd;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      molecules_[mol->getGlobalIndex()] = mol;

      // Hull is constructed from all known integrable objects.
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        localSites_.push_back(sd);
      }

      // selection can include atoms (which may be a subset of the IOs)
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        stuntdoubles_[atom->getGlobalIndex()] = atom;
      }

      // and rigid bodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        stuntdoubles_[rb->getGlobalIndex()] = rb;
      }

      // These others are going to be inferred from the objects on the hull:
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bonds_[bond->getGlobalIndex()] = bond;
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        bends_[bend->getGlobalIndex()] = bend;
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        torsions_[torsion->getGlobalIndex()] = torsion;
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        inversions_[inversion->getGlobalIndex()] = inversion;
      }
    }
#ifdef HAVE_QHULL
    surfaceMesh_ = new ConvexHull();
#endif
  }